

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

int cmIsOn(void *arg,char *name)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  bVar1 = cmMakefile::IsOn((cmMakefile *)arg,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return (uint)bVar1;
}

Assistant:

int CCONV cmIsOn(void *arg, const char* name)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  return static_cast<int>(mf->IsOn(name));
}